

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

shared_ptr<aeron::Publication> __thiscall
aeron::ClientConductor::findPublication(ClientConductor *this,int64_t registrationId)

{
  undefined4 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  SourcedException *pSVar6;
  char *pcVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  _func_int **pp_Var10;
  pointer in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  shared_ptr<aeron::Publication> sVar13;
  allocator local_e9;
  string local_e8;
  UnsafeBufferPosition publicationLimit;
  string local_90;
  string local_70;
  string local_50;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)(registrationId + 8));
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pbVar12 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (registrationId + 0x30);
  pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (registrationId + 0x38);
  lVar11 = ((long)pbVar2 - (long)pbVar12 >> 4) * -0x71c71c71c71c71c7 >> 2;
  pbVar9 = pbVar12;
  if (0 < lVar11) {
    pbVar9 = pbVar12 + lVar11 * 0x12;
    lVar11 = lVar11 + 1;
    pbVar12 = pbVar12 + 9;
    do {
      if (pbVar12[-8]._M_dataplus._M_p == in_RDX) {
        pbVar12 = pbVar12 + -9;
        goto LAB_0013e7f7;
      }
      if ((pointer)pbVar12[-4].field_2._M_allocated_capacity == in_RDX) {
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &pbVar12[-5].field_2;
        goto LAB_0013e7f7;
      }
      if (pbVar12[1]._M_dataplus._M_p == in_RDX) goto LAB_0013e7f7;
      if ((pointer)pbVar12[5].field_2._M_allocated_capacity == in_RDX) {
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &pbVar12[4].field_2;
        goto LAB_0013e7f7;
      }
      lVar11 = lVar11 + -1;
      pbVar12 = pbVar12 + 0x12;
    } while (1 < lVar11);
  }
  lVar11 = ((long)pbVar2 - (long)pbVar9 >> 4) * -0x71c71c71c71c71c7;
  if (lVar11 != 1) {
    if (lVar11 != 2) {
      pbVar12 = pbVar2;
      if ((lVar11 != 3) || (pbVar12 = pbVar9, pbVar9[1]._M_dataplus._M_p == in_RDX))
      goto LAB_0013e7f7;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pbVar9[4].field_2;
    }
    pbVar12 = pbVar9;
    if (pbVar9[1]._M_dataplus._M_p == in_RDX) goto LAB_0013e7f7;
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar9[4].field_2
    ;
  }
  pbVar12 = pbVar9;
  if (pbVar9[1]._M_dataplus._M_p != in_RDX) {
    pbVar12 = pbVar2;
  }
LAB_0013e7f7:
  if (pbVar12 == pbVar2) {
    this->_vptr_ClientConductor = (_func_int **)0x0;
    (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = 0;
  }
  else {
    std::__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)this,pbVar12 + 4);
    if (this->_vptr_ClientConductor == (_func_int **)0x0) {
      iVar5 = (int)pbVar12[2]._M_string_length;
      if (iVar5 == 0) {
        if (*(long *)(registrationId + 0x1e8) == 0) {
          std::__throw_bad_function_call();
        }
        lVar11 = (**(code **)(registrationId + 0x1f0))(registrationId + 0x1d8);
        if ((long)(pbVar12[2]._M_dataplus._M_p + *(long *)(registrationId + 0x210)) < lVar11) {
          pSVar6 = (SourcedException *)__cxa_allocate_exception(0x48);
          std::__cxx11::to_string(&local_70,*(long *)(registrationId + 0x210));
          std::operator+(&local_e8,"no response from driver in ",&local_70);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
          publicationLimit.m_buffer._vptr_AtomicBuffer = (_func_int **)*plVar8;
          pp_Var10 = (_func_int **)(plVar8 + 2);
          if (publicationLimit.m_buffer._vptr_AtomicBuffer == pp_Var10) {
            publicationLimit.m_buffer._16_8_ = *pp_Var10;
            publicationLimit.m_id = (int32_t)plVar8[3];
            publicationLimit.m_offset = *(int32_t *)((long)plVar8 + 0x1c);
            publicationLimit.m_buffer._vptr_AtomicBuffer =
                 (_func_int **)&publicationLimit.m_buffer.m_length;
          }
          else {
            publicationLimit.m_buffer._16_8_ = *pp_Var10;
          }
          publicationLimit.m_buffer.m_buffer = (uint8_t *)plVar8[1];
          *plVar8 = (long)pp_Var10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,
                     "std::shared_ptr<Publication> aeron::ClientConductor::findPublication(std::int64_t)"
                     ,"");
          pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                     ,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                    );
          std::__cxx11::string::string((string *)&local_50,pcVar7,&local_e9);
          util::SourcedException::SourcedException
                    (pSVar6,(string *)&publicationLimit,&local_90,&local_50,0x62);
          *(undefined ***)pSVar6 = &PTR__SourcedException_001624e0;
          __cxa_throw(pSVar6,&util::DriverTimeoutException::typeinfo,
                      util::SourcedException::~SourcedException);
        }
      }
      else if (iVar5 == 1) {
        publicationLimit.m_id = *(int *)((long)&pbVar12[1].field_2 + 8);
        publicationLimit.m_buffer._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_00162160;
        publicationLimit.m_buffer.m_buffer = *(uint8_t **)(*(long *)(registrationId + 0x110) + 8);
        publicationLimit.m_buffer.m_length = *(length_t *)(*(long *)(registrationId + 0x110) + 0x10)
        ;
        publicationLimit.m_offset = publicationLimit.m_id << 7;
        local_e8._M_dataplus._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<aeron::Publication,std::allocator<aeron::Publication>,aeron::ClientConductor&,std::__cxx11::string&,long&,long&,int&,int&,aeron::concurrent::status::UnsafeBufferPosition&,int&,std::shared_ptr<aeron::LogBuffers>&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length,
                   (Publication **)&local_e8,(allocator<aeron::Publication> *)&local_70,
                   (ClientConductor *)registrationId,pbVar12,(long *)(pbVar12 + 1),
                   (long *)&pbVar12[1]._M_string_length,(int *)pbVar12[1].field_2._M_local_buf,
                   (int *)(pbVar12[1].field_2._M_local_buf + 4),&publicationLimit,
                   (int *)(pbVar12[1].field_2._M_local_buf + 0xc),
                   (shared_ptr<aeron::LogBuffers> *)&pbVar12[3].field_2);
        sVar4 = local_e8._M_string_length;
        _Var3._M_p = local_e8._M_dataplus._M_p;
        local_e8._M_dataplus._M_p = (pointer)0x0;
        local_e8._M_string_length = 0;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align;
        this->_vptr_ClientConductor = (_func_int **)_Var3._M_p;
        (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = sVar4;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
        }
        local_e8._M_dataplus._M_p = (pointer)this->_vptr_ClientConductor;
        local_e8._M_string_length =
             (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align;
        if ((long *)local_e8._M_string_length != (long *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_e8._M_string_length + 0xc) =
                 *(int *)(local_e8._M_string_length + 0xc) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_e8._M_string_length + 0xc) =
                 *(int *)(local_e8._M_string_length + 0xc) + 1;
          }
        }
        std::__weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)(pbVar12 + 4),
                   (__weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)&local_e8);
        if ((long *)local_e8._M_string_length != (long *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            lVar11 = local_e8._M_string_length + 0xc;
            iVar5 = *(int *)lVar11;
            *(int *)lVar11 = *(int *)lVar11 + -1;
            UNLOCK();
          }
          else {
            iVar5 = *(int *)(local_e8._M_string_length + 0xc);
            *(int *)(local_e8._M_string_length + 0xc) = iVar5 + -1;
          }
          if (iVar5 == 1) {
            (**(code **)(*(long *)local_e8._M_string_length + 0x18))();
          }
        }
      }
      else if (iVar5 == 2) {
        pSVar6 = (SourcedException *)__cxa_allocate_exception(0x50);
        uVar1 = *(undefined4 *)((long)&pbVar12[2]._M_string_length + 4);
        publicationLimit.m_buffer._vptr_AtomicBuffer =
             (_func_int **)&publicationLimit.m_buffer.m_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&publicationLimit,
                   "std::shared_ptr<Publication> aeron::ClientConductor::findPublication(std::int64_t)"
                   ,"");
        pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                   ,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                  );
        std::__cxx11::string::string((string *)&local_e8,pcVar7,(allocator *)&local_70);
        util::SourcedException::SourcedException
                  (pSVar6,(string *)&pbVar12[2].field_2,(string *)&publicationLimit,&local_e8,0x73);
        *(undefined ***)pSVar6 = &PTR__SourcedException_001627c8;
        *(undefined4 *)(pSVar6 + 1) = uVar1;
        __cxa_throw(pSVar6,&util::RegistrationException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(registrationId + 8));
  sVar13.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar13.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Publication>)
         sVar13.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Publication> ClientConductor::findPublication(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_publications.begin(), m_publications.end(),
        [registrationId](const PublicationStateDefn &entry)
        {
            return (registrationId == entry.m_registrationId);
        });

    if (it == m_publications.end())
    {
        return std::shared_ptr<Publication>();
    }

    PublicationStateDefn& state = (*it);
    std::shared_ptr<Publication> pub(state.m_publication.lock());

    if (!pub)
    {
        switch (state.m_status)
        {
            case RegistrationStatus::AWAITING_MEDIA_DRIVER:
                if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
                {
                    throw DriverTimeoutException(
                        "no response from driver in " + std::to_string(m_driverTimeoutMs) +" ms", SOURCEINFO);
                }
                break;

            case RegistrationStatus::REGISTERED_MEDIA_DRIVER:
            {
                UnsafeBufferPosition publicationLimit(m_counterValuesBuffer, state.m_publicationLimitCounterId);

                pub = std::make_shared<Publication>(
                    *this, state.m_channel, state.m_registrationId, state.m_originalRegistrationId,
                    state.m_streamId, state.m_sessionId, publicationLimit, state.m_channelStatusId, state.m_buffers);

                state.m_publication = std::weak_ptr<Publication>(pub);
                break;
            }

            case RegistrationStatus::ERRORED_MEDIA_DRIVER:
                throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
        }
    }

    return pub;
}